

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

CFinfo * amrex::FabArrayBase::TheCFinfo
                   (FabArrayBase *finefa,Geometry *finegm,IntVect *ng,bool include_periodic,
                   bool include_physbndry)

{
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  CFinfo *pCVar5;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>
  _Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
  pVar9;
  key_type local_68;
  undefined1 local_58 [16];
  CFinfo *local_48;
  
  local_68.m_ba_id.data =
       (finefa->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.m_dm_id.data =
       (finefa->distributionMap).m_ref.
       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVar9 = std::
          _Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
          ::equal_range((_Rb_tree<amrex::FabArrayBase::BDKey,_std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>,_std::_Select1st<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*>_>_>
                         *)m_TheCrseFineCache,&local_68);
  p_Var4 = (_Rb_tree_node_base *)(ulong)include_physbndry;
  _Var6._M_node = pVar9.first._M_node._M_node;
  do {
    if (_Var6._M_node == (_Base_ptr)pVar9.second._M_node) {
      pCVar5 = (CFinfo *)operator_new(0xd8);
      CFinfo::CFinfo(pCVar5,finefa,finegm,ng,include_periodic,include_physbndry);
      pCVar5->m_nuse = 1;
      CacheStats::recordBuild((CacheStats *)m_CFinfo_stats);
      m_CFinfo_stats._16_8_ = m_CFinfo_stats._16_8_ + 1;
      local_58._0_8_ = local_68.m_ba_id.data;
      local_58._8_8_ = local_68.m_dm_id.data;
      local_48 = pCVar5;
      std::
      _Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>
      ::_M_insert_equal_<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>
                ((_Rb_tree<amrex::FabArrayBase::BDKey,std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>,std::_Select1st<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>,std::less<amrex::FabArrayBase::BDKey>,std::allocator<std::pair<amrex::FabArrayBase::BDKey_const,amrex::FabArrayBase::CFinfo*>>>
                  *)m_TheCrseFineCache,(_Base_ptr)pVar9.second._M_node,
                 (pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::CFinfo_*> *)local_58);
      return pCVar5;
    }
    p_Var1 = _Var6._M_node[1]._M_left;
    auVar7._0_4_ = -(uint)(*(int *)&p_Var1[4]._M_left == (int)local_68.m_ba_id.data);
    auVar7._4_4_ = -(uint)(*(int *)((long)&p_Var1[4]._M_left + 4) == local_68.m_ba_id.data._4_4_);
    auVar7._8_4_ = -(uint)(*(int *)&p_Var1[4]._M_right == (int)local_68.m_dm_id.data);
    auVar7._12_4_ = -(uint)(*(int *)((long)&p_Var1[4]._M_right + 4) == local_68.m_dm_id.data._4_4_);
    auVar8._4_4_ = auVar7._0_4_;
    auVar8._0_4_ = auVar7._4_4_;
    auVar8._8_4_ = auVar7._12_4_;
    auVar8._12_4_ = auVar7._8_4_;
    iVar3 = movmskpd((int)p_Var4,auVar8 & auVar7);
    if (iVar3 == 3) {
      CFinfo::Domain((Box *)local_58,finegm,ng,include_periodic,include_physbndry);
      bVar2 = Box::operator==((Box *)(p_Var1 + 5),(Box *)local_58);
      if ((((bVar2) &&
           (pCVar5 = (CFinfo *)_Var6._M_node[1]._M_left, (pCVar5->m_ng).vect[0] == ng->vect[0])) &&
          ((pCVar5->m_ng).vect[1] == ng->vect[1])) && ((pCVar5->m_ng).vect[2] == ng->vect[2])) {
        pCVar5->m_nuse = pCVar5->m_nuse + 1;
        m_CFinfo_stats._16_8_ = m_CFinfo_stats._16_8_ + 1;
        return pCVar5;
      }
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(_Var6._M_node);
    _Var6._M_node = p_Var4;
  } while( true );
}

Assistant:

const FabArrayBase::CFinfo&
FabArrayBase::TheCFinfo (const FabArrayBase& finefa,
                         const Geometry&     finegm,
                         const IntVect&      ng,
                         bool                include_periodic,
                         bool                include_physbndry)
{
    BL_PROFILE("FabArrayBase::TheCFinfo()");

    const BDKey& key = finefa.getBDKey();
    auto er_it = m_TheCrseFineCache.equal_range(key);
    for (auto it = er_it.first; it != er_it.second; ++it)
    {
        if (it->second->m_fine_bdk    == key                        &&
            it->second->m_fine_domain == CFinfo::Domain(finegm, ng,
                                                        include_periodic,
                                                        include_physbndry) &&
            it->second->m_ng          == ng)
        {
            ++(it->second->m_nuse);
            m_CFinfo_stats.recordUse();
            return *(it->second);
        }
    }

    // Have to build a new one
    CFinfo* new_cfinfo = new CFinfo(finefa, finegm, ng, include_periodic, include_physbndry);

#ifdef AMREX_MEM_PROFILING
    m_CFinfo_stats.bytes += new_cfinfo->bytes();
    m_CFinfo_stats.bytes_hwm = std::max(m_CFinfo_stats.bytes_hwm, m_CFinfo_stats.bytes);
#endif

    new_cfinfo->m_nuse = 1;
    m_CFinfo_stats.recordBuild();
    m_CFinfo_stats.recordUse();

    m_TheCrseFineCache.insert(er_it.second, CFinfoCache::value_type(key,new_cfinfo));

    return *new_cfinfo;
}